

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SixAxisForceTorqueSensor.cpp
# Opt level: O2

string * __thiscall
iDynTree::SixAxisForceTorqueSensor::getFirstLinkName_abi_cxx11_
          (string *__return_storage_ptr__,SixAxisForceTorqueSensor *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->pimpl->link1Name);
  return __return_storage_ptr__;
}

Assistant:

std::string SixAxisForceTorqueSensor::getFirstLinkName() const
{
    return this->pimpl->link1Name;
}